

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

bool __thiscall
ON_ClassArray<ON_CurveProxyHistory>::HeapSort
          (ON_ClassArray<ON_CurveProxyHistory> *this,
          _func_int_ON_CurveProxyHistory_ptr_ON_CurveProxyHistory_ptr *compar)

{
  uint uVar1;
  
  if (this->m_a != (ON_CurveProxyHistory *)0x0) {
    uVar1 = this->m_count;
    if (compar != (_func_int_ON_CurveProxyHistory_ptr_ON_CurveProxyHistory_ptr *)0x0 &&
        0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      ON_hsort(this->m_a,(long)(int)uVar1,0x158,(_func_int_void_ptr_void_ptr *)compar);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ClassArray<T>::HeapSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar ) 
  {
    if ( m_count > 1 )
      ON_hsort( m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    rc = true;
  }
  return rc;
}